

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senone.c
# Opt level: O1

senone_t * senone_init(logmath_t *logmath,char *mixwfile,char *sen2mgau_map,float64 mixwfloor)

{
  uint32 **buf;
  uint uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 *puVar4;
  bool bVar5;
  logmath_t *lmath;
  int iVar6;
  int32 iVar7;
  float fVar8;
  senone_t *psVar9;
  FILE *pFVar10;
  size_t sVar11;
  mgau2sen_t *pmVar12;
  uint32 *puVar13;
  void *pvVar14;
  mixw_t *pmVar15;
  senprob_t **ppsVar16;
  float32 *vec;
  char *fmt;
  ulong uVar17;
  size_t d2;
  bool bVar18;
  long lVar19;
  senprob_t ***pppsVar20;
  uint uVar21;
  ulong uVar22;
  char *pcVar23;
  int32 n_cw;
  int32 byteswap;
  uint32 chksum;
  char **argval;
  char **argname;
  char eofchk;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 uVar24;
  float local_b4;
  int32 local_b0;
  uint32 local_ac;
  senone_t *local_a8;
  char local_99;
  char *local_98;
  char **local_90;
  char *local_88;
  char **local_80;
  undefined1 local_71;
  FILE *local_70;
  uint local_64;
  float64 local_60;
  FILE *local_58;
  uint32 *local_50;
  ulong local_48;
  mixw_t *local_40;
  logmath_t *local_38;
  undefined4 uVar25;
  
  local_60 = mixwfloor;
  psVar9 = (senone_t *)
           __ckd_calloc__(1,0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                          ,0x154);
  psVar9->n_sen = 0;
  psVar9->sen2mgau = (uint32 *)0x0;
  if (sen2mgau_map == (char *)0x0) {
    __assert_fail("sen2mgau_map",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,0x158,"senone_t *senone_init(logmath_t *, const char *, const char *, float64)");
  }
  iVar6 = strcmp(sen2mgau_map,".semi.");
  local_a8 = psVar9;
  local_88 = mixwfile;
  local_38 = logmath;
  if (iVar6 == 0) {
    psVar9->n_mgau = 1;
LAB_00103359:
    if (mixwfile == (char *)0x0) {
      __assert_fail("mixwfile",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,0x165,"senone_t *senone_init(logmath_t *, const char *, const char *, float64)"
                   );
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0xd2,"Reading senone mixture weights: %s\n",mixwfile);
    pFVar10 = fopen(mixwfile,"rb");
    if (pFVar10 != (FILE *)0x0) {
      iVar7 = bio_readhdr((FILE *)pFVar10,&local_80,&local_90,&local_b0);
      if (iVar7 < 0) {
        pcVar23 = "bio_readhdr(%s) failed\n";
        lVar19 = 0xd9;
      }
      else {
        pcVar23 = *local_80;
        local_58 = pFVar10;
        if (pcVar23 == (char *)0x0) {
          bVar18 = true;
        }
        else {
          lVar19 = 0;
          bVar18 = false;
          do {
            iVar6 = strcmp(pcVar23,"version");
            if (iVar6 == 0) {
              pcVar23 = *(char **)((long)local_90 + lVar19);
              iVar6 = strcmp(pcVar23,"1.0");
              if (iVar6 != 0) {
                in_stack_ffffffffffffff28 = 0;
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                        ,0xe1,"Version mismatch(%s): %s, expecting %s\n",local_88,pcVar23,"1.0");
              }
            }
            else {
              iVar6 = strcmp(pcVar23,"chksum0");
              if (iVar6 == 0) {
                bVar18 = true;
              }
            }
            pcVar23 = *(char **)((long)local_80 + lVar19 + 8);
            lVar19 = lVar19 + 8;
          } while (pcVar23 != (char *)0x0);
          bVar18 = !bVar18;
        }
        pFVar10 = local_58;
        bio_hdrarg_free(local_80,local_90);
        local_90 = (char **)0x0;
        local_80 = (char **)0x0;
        local_ac = 0;
        uVar1 = local_a8->n_sen;
        iVar7 = bio_fread(local_a8,4,1,(FILE *)pFVar10,local_b0,&local_ac);
        if (iVar7 == 1) {
          local_50 = &local_a8->n_feat;
          iVar7 = bio_fread(local_50,4,1,(FILE *)pFVar10,local_b0,&local_ac);
          if (((iVar7 == 1) &&
              (iVar7 = bio_fread(&local_b4,4,1,(FILE *)pFVar10,local_b0,&local_ac), iVar7 == 1)) &&
             (iVar7 = bio_fread(&local_64,4,1,(FILE *)pFVar10,local_b0,&local_ac), iVar7 == 1)) {
            if ((uVar1 != 0) && (uVar22 = (ulong)local_a8->n_sen, local_a8->n_sen != uVar1)) {
              pcVar23 = "#senones(%d) conflict with mapping file(%d)\n";
              lVar19 = 0xf4;
LAB_00103aed:
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                      ,lVar19,pcVar23,uVar22,(ulong)uVar1);
              goto LAB_00103aa6;
            }
            uVar17 = (ulong)local_a8->n_sen;
            if (0x7ffe < uVar17) {
              uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
              lVar19 = 0xf6;
              pcVar23 = local_88;
              goto LAB_00103d7d;
            }
            if (*local_50 == 0) {
              pcVar23 = "Bad #features: %d\n";
              lVar19 = 0xf8;
              uVar22 = 0;
            }
            else {
              uVar22 = (ulong)(uint)local_b4;
              if (0 < (int)local_b4) {
                if (local_a8->sen2mgau == (uint32 *)0x0) {
                  if (1 < local_a8->n_mgau) {
                    __assert_fail("(s->n_mgau == 0) || (s->n_mgau == 1)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                  ,0xfe,
                                  "int32 senone_mixw_read(logmath_t *, senone_t *, const char *, float64)"
                                 );
                  }
                  puVar13 = (uint32 *)
                            __ckd_calloc__(uVar17,4,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                           ,0x100);
                  local_a8->sen2mgau = puVar13;
                  uVar2 = local_a8->n_sen;
                  if (local_a8->n_mgau == 1) {
                    if (uVar2 != 0) {
                      uVar17 = 0;
                      do {
                        puVar13[uVar17] = 0;
                        uVar17 = uVar17 + 1;
                      } while (uVar17 < local_a8->n_sen);
                    }
                  }
                  else {
                    local_a8->n_mgau = uVar2;
                    if (uVar2 != 0) {
                      uVar17 = 0;
                      do {
                        puVar13[uVar17] = (uint32)uVar17;
                        uVar17 = uVar17 + 1;
                      } while (uVar17 < local_a8->n_sen);
                    }
                  }
                }
                else if (local_a8->n_mgau == 0) {
                  __assert_fail("s->n_mgau != 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                ,0x10d,
                                "int32 senone_mixw_read(logmath_t *, senone_t *, const char *, float64)"
                               );
                }
                fVar8 = local_b4;
                uVar21 = local_a8->n_mgau;
                uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
                pcVar23 = local_88;
                if ((ulong)uVar21 < 0x7fff) {
                  uVar17 = (ulong)local_64;
                  if (local_64 == local_a8->n_feat * local_a8->n_sen * (int)local_b4) {
                    if (((double)local_60 <= 0.0) || (1.0 <= (double)local_60)) {
                      err_msg(ERR_FATAL,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                              ,0x11b,"mixwfloor (%e) not in range (0, 1)\n");
                      goto LAB_00103aa6;
                    }
                    pmVar12 = (mgau2sen_t *)
                              __ckd_calloc__((ulong)uVar21,0x18,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                             ,0xa2);
                    psVar9 = local_a8;
                    local_a8->mgau2sen = pmVar12;
                    puVar13 = (uint32 *)
                              __ckd_calloc__((ulong)local_a8->n_sen,4,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                             ,0xa3);
                    psVar9->mgau2sen_idx = puVar13;
                    uVar17 = (ulong)psVar9->n_sen;
                    if (uVar17 != 0) {
                      puVar13 = psVar9->sen2mgau;
                      uVar21 = psVar9->n_mgau;
                      uVar22 = 0;
                      do {
                        uVar1 = puVar13[uVar22];
                        if (((long)(int)uVar1 < 0) || (uVar21 <= uVar1)) {
                          __assert_fail("(m < s->n_mgau) && (m >= 0)",
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                        ,0xa6,"void build_mgau2sen(senone_t *, int32)");
                        }
                        psVar9->mgau2sen[(int)uVar1].n_sen = psVar9->mgau2sen[(int)uVar1].n_sen + 1;
                        uVar22 = uVar22 + 1;
                      } while (uVar17 != uVar22);
                    }
                    local_70 = (FILE *)CONCAT44(local_70._4_4_,fVar8);
                    pvVar14 = __ckd_calloc__(uVar17,2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                             ,0xaa);
                    uVar21 = local_a8->n_mgau;
                    if ((ulong)uVar21 != 0) {
                      pmVar12 = local_a8->mgau2sen;
                      lVar19 = 0;
                      do {
                        *(void **)((long)&pmVar12->sen + lVar19) = pvVar14;
                        pvVar14 = (void *)((long)pvVar14 +
                                          (long)*(int *)((long)&pmVar12->n_sen + lVar19) * 2);
                        *(undefined4 *)((long)&pmVar12->n_sen + lVar19) = 0;
                        lVar19 = lVar19 + 0x18;
                      } while ((ulong)uVar21 * 0x18 != lVar19);
                    }
                    if (local_a8->n_sen != 0) {
                      pmVar12 = local_a8->mgau2sen;
                      puVar13 = local_a8->sen2mgau;
                      puVar4 = local_a8->mgau2sen_idx;
                      uVar17 = 0;
                      do {
                        uVar2 = puVar13[uVar17];
                        uVar3 = pmVar12[(int)uVar2].n_sen;
                        pmVar12[(int)uVar2].sen[(int)uVar3] = (s3senid_t)uVar17;
                        puVar4[uVar17] = uVar3;
                        pmVar12[(int)uVar2].n_sen = pmVar12[(int)uVar2].n_sen + 1;
                        uVar17 = uVar17 + 1;
                      } while (uVar17 < local_a8->n_sen);
                    }
                    local_99 = bVar18;
                    if (local_a8->n_mgau != 0) {
                      iVar6 = (int)local_70;
                      d2 = (size_t)(int)local_70;
                      pcVar23 = (char *)0x0;
                      do {
                        pmVar15 = (mixw_t *)
                                  __ckd_calloc__((ulong)local_a8->n_feat,0x10,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                                 ,0xbb);
                        local_a8->mgau2sen[(long)pcVar23].feat_mixw = pmVar15;
                        local_98 = pcVar23;
                        if (local_a8->n_feat != 0) {
                          pppsVar20 = &pmVar15->prob;
                          uVar17 = 0;
                          do {
                            ((mixw_t *)(pppsVar20 + -1))->n_wt = iVar6;
                            ppsVar16 = (senprob_t **)
                                       __ckd_calloc_2d__((long)local_a8->mgau2sen[(long)pcVar23].
                                                               n_sen,d2,1,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                                  ,0xc1);
                            *pppsVar20 = ppsVar16;
                            uVar17 = uVar17 + 1;
                            pppsVar20 = pppsVar20 + 2;
                          } while (uVar17 < local_a8->n_feat);
                        }
                        pcVar23 = local_98 + 1;
                      } while (pcVar23 < (char *)(ulong)local_a8->n_mgau);
                    }
                    vec = (float32 *)
                          __ckd_calloc__((long)(int)local_b4,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                         ,0x121);
                    uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
                    pFVar10 = local_58;
                    psVar9 = local_a8;
                    if (local_a8->n_sen == 0) {
                      uVar21 = 0;
                    }
                    else {
                      local_60 = (float64)CONCAT44(local_60._4_4_,(float)(double)local_60);
                      uVar17 = 0;
                      uVar21 = 0;
                      do {
                        local_48 = uVar17;
                        if (psVar9->n_feat != 0) {
                          local_40 = psVar9->mgau2sen[(int)psVar9->sen2mgau[uVar17]].feat_mixw;
                          uVar2 = psVar9->mgau2sen_idx[uVar17];
                          uVar17 = 0;
                          do {
                            fVar8 = (float)bio_fread(vec,4,(int32)local_b4,(FILE *)pFVar10,local_b0,
                                                     &local_ac);
                            if (fVar8 != local_b4) {
                              pcVar23 = "bio_fread(%s) (arraydata) failed\n";
                              lVar19 = 0x12d;
                              mixwfile = local_88;
                              goto LAB_00103a9f;
                            }
                            local_98 = (char *)CONCAT44(local_98._4_4_,uVar21);
                            local_70 = (FILE *)vector_sum_norm(vec,(int32)local_b4);
                            vector_floor((vector_t)vec,(uint32)local_b4,local_60._0_4_);
                            vector_sum_norm(vec,(int32)local_b4);
                            lmath = local_38;
                            if (0 < (int)local_b4) {
                              pmVar15 = local_40 + uVar17;
                              lVar19 = 0;
                              do {
                                iVar6 = logmath_log(lmath,(float64)(double)(float)vec[lVar19]);
                                pmVar15->prob[(int)uVar2][lVar19] = -(char)iVar6;
                                lVar19 = lVar19 + 1;
                              } while (lVar19 < (int)local_b4);
                            }
                            uVar21 = (int)local_98 + (uint)((double)local_70 == 0.0);
                            uVar17 = uVar17 + 1;
                            pFVar10 = local_58;
                            psVar9 = local_a8;
                          } while (uVar17 < *local_50);
                        }
                        uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
                        uVar17 = local_48 + 1;
                      } while (uVar17 < psVar9->n_sen);
                    }
                    if (0 < (int)uVar21) {
                      err_msg(ERR_WARN,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                              ,0x13e,"Weight normalization failed for %d senones\n",(ulong)uVar21);
                    }
                    ckd_free(vec);
                    if (local_99 == '\0') {
                      bio_verify_chksum((FILE *)pFVar10,local_b0,local_ac);
                    }
                    sVar11 = fread(&local_71,1,1,pFVar10);
                    if (sVar11 != 1) {
                      fclose(pFVar10);
                      err_msg(ERR_INFO,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                              ,0x14b,
                              "Read mixture weights for %d senones: %d features x %d codewords\n",
                              (ulong)psVar9->n_sen,(ulong)psVar9->n_feat,CONCAT44(uVar25,local_b4));
                      return psVar9;
                    }
                    pcVar23 = "More data than expected in %s\n";
                    lVar19 = 0x146;
                    mixwfile = local_88;
                    goto LAB_00103a9f;
                  }
                  uVar24 = CONCAT44(uVar25,local_a8->n_sen);
                  fmt = "%s: #float32 values(%d) doesn\'t match dimensions: %d x %d x %d\n";
                  lVar19 = 0x113;
                }
                else {
                  uVar24 = CONCAT44(uVar25,0x7fff);
                  fmt = "%s: #gauden (%d) exceeds limit (%d)\n";
                  lVar19 = 0x10f;
                  uVar17 = (ulong)uVar21;
                }
LAB_00103da6:
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                        ,lVar19,fmt,pcVar23,uVar17,uVar24);
                goto LAB_00103aa6;
              }
              pcVar23 = "Bad #mixing-wts/senone: %d\n";
              lVar19 = 0xfa;
            }
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,lVar19,pcVar23,uVar22);
            goto LAB_00103aa6;
          }
        }
        pcVar23 = "bio_fread(%s) (arraysize) failed\n";
        lVar19 = 0xf1;
        mixwfile = local_88;
      }
LAB_00103a9f:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
              ,lVar19,pcVar23,mixwfile);
      goto LAB_00103aa6;
    }
    lVar19 = 0xd5;
  }
  else {
    iVar6 = strcmp(sen2mgau_map,".cont.");
    if (iVar6 == 0) {
      psVar9->n_mgau = 0;
      goto LAB_00103359;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x4a,"Reading senone-codebook map file: %s\n",sen2mgau_map);
    pFVar10 = fopen(sen2mgau_map,"rb");
    mixwfile = sen2mgau_map;
    if (pFVar10 != (FILE *)0x0) {
      iVar7 = bio_readhdr((FILE *)pFVar10,&local_80,&local_90,&local_b0);
      if (-1 < iVar7) {
        pcVar23 = *local_80;
        local_98 = sen2mgau_map;
        if (pcVar23 == (char *)0x0) {
          bVar5 = true;
          bVar18 = true;
        }
        else {
          lVar19 = 0;
          bVar18 = false;
          bVar5 = false;
          local_70 = pFVar10;
          do {
            iVar6 = strcmp(pcVar23,"version");
            if (iVar6 == 0) {
              pcVar23 = *(char **)((long)local_90 + lVar19);
              iVar6 = strcmp(pcVar23,"1.2");
              if (iVar6 != 0) {
                in_stack_ffffffffffffff28 = 0;
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                        ,0x5a,"Version mismatch(%s): %s, expecting %s\n",local_98,pcVar23,"1.2");
              }
              iVar6 = __isoc99_sscanf(*(undefined8 *)((long)local_90 + lVar19),"%f",&local_b4);
              if (iVar6 != 1) {
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                        ,0x5f,"%s: Bad version no. string: %s\n",local_98,
                        *(undefined8 *)((long)local_90 + lVar19));
                goto LAB_00103aa6;
              }
              bVar18 = 1.1 < local_b4;
            }
            else {
              iVar6 = strcmp(pcVar23,"chksum0");
              if (iVar6 == 0) {
                bVar5 = true;
              }
            }
            pcVar23 = *(char **)((long)local_80 + lVar19 + 8);
            lVar19 = lVar19 + 8;
          } while (pcVar23 != (char *)0x0);
          bVar18 = !bVar18;
          bVar5 = !bVar5;
          pFVar10 = local_70;
        }
        bio_hdrarg_free(local_80,local_90);
        local_90 = (char **)0x0;
        local_80 = (char **)0x0;
        local_ac = 0;
        if ((!bVar18) &&
           (iVar7 = bio_fread(&local_a8->n_mgau,4,1,(FILE *)pFVar10,local_b0,&local_ac), iVar7 != 1)
           ) {
          pcVar23 = "fread(%s) (#gauden) failed\n";
          lVar19 = 0x6e;
          mixwfile = local_98;
          goto LAB_00103a9f;
        }
        buf = &local_a8->sen2mgau;
        iVar7 = bio_fread_1d(buf,4,&local_a8->n_sen,(FILE *)pFVar10,local_b0,&local_ac);
        if (iVar7 < 0) {
          pcVar23 = "bio_fread_1d(%s) failed\n";
          lVar19 = 0x74;
          mixwfile = local_98;
          goto LAB_00103a9f;
        }
        if (bVar18) {
          local_a8->n_mgau = 1;
          if ((ulong)local_a8->n_sen != 0) {
            puVar13 = *buf;
            uVar21 = 1;
            uVar17 = 0;
            do {
              if (uVar21 <= puVar13[uVar17]) {
                uVar21 = puVar13[uVar17] + 1;
                local_a8->n_mgau = uVar21;
              }
              uVar17 = uVar17 + 1;
            } while (local_a8->n_sen != uVar17);
          }
        }
        uVar17 = (ulong)local_a8->n_sen;
        uVar25 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
        pcVar23 = local_98;
        if (uVar17 < 0x7fff) {
          uVar21 = local_a8->n_mgau;
          if (uVar21 < 0x7fff) {
            if (uVar17 != 0) {
              uVar22 = 0;
              do {
                uVar1 = (*buf)[uVar22];
                if (uVar21 <= uVar1) {
                  pcVar23 = "Bad sen2mgau[%d]= %d, out of range [0, %d)\n";
                  lVar19 = 0x89;
                  goto LAB_00103aed;
                }
                uVar22 = uVar22 + 1;
              } while (uVar17 != uVar22);
            }
            if (!bVar5) {
              bio_verify_chksum((FILE *)pFVar10,local_b0,local_ac);
            }
            sVar11 = fread(&local_64,1,1,pFVar10);
            mixwfile = local_88;
            if (sVar11 != 1) {
              fclose(pFVar10);
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                      ,0x94,"Read %d->%d senone-codebook mappings\n",(ulong)local_a8->n_sen,
                      (ulong)local_a8->n_mgau);
              goto LAB_00103359;
            }
            pcVar23 = "More data than expected in %s\n";
            lVar19 = 0x90;
            mixwfile = local_98;
            goto LAB_00103a9f;
          }
          uVar24 = CONCAT44(uVar25,0x7fff);
          fmt = "%s: #gauden (%d) exceeds limit (%d)\n";
          lVar19 = 0x83;
          uVar17 = (ulong)uVar21;
          goto LAB_00103da6;
        }
        lVar19 = 0x81;
LAB_00103d7d:
        uVar24 = CONCAT44(uVar25,0x7fff);
        fmt = "%s: #senones (%d) exceeds limit (%d)\n";
        goto LAB_00103da6;
      }
      pcVar23 = "bio_readhdr(%s) failed\n";
      lVar19 = 0x51;
      goto LAB_00103a9f;
    }
    lVar19 = 0x4d;
  }
  err_msg_system(ERR_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                 ,lVar19,"fopen(%s,rb) failed\n",mixwfile);
LAB_00103aa6:
  exit(1);
}

Assistant:

senone_t *senone_init (logmath_t *logmath, const char *mixwfile, const char *sen2mgau_map, float64 mixwfloor)
{
    senone_t *s;
    
    s = (senone_t *) ckd_calloc (1, sizeof(senone_t));
    s->n_sen = 0;	/* As yet unknown */
    s->sen2mgau = NULL;

    assert (sen2mgau_map);

    if (strcmp (sen2mgau_map, ".semi.") == 0) {
	/* Not a file; map all senones to a single parent mgau */
	s->n_mgau = 1;	/* But we don't yet know the #senones */
    } else if (strcmp (sen2mgau_map, ".cont.") == 0) {
	/* Not a file; map each senone to its own distinct parent mgau */
	s->n_mgau = 0;	/* We don't yet know the #senones */
    } else {
	/* Read mapping file */
	senone_mgau_map_read (s, sen2mgau_map);	/* Fills in n_sen */
    }
    
    assert (mixwfile);
    senone_mixw_read (logmath, s, mixwfile, mixwfloor);
    
    return s;
}